

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
* __thiscall
xmotion::utils::
ReconstructPath<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator>
          (vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
           *__return_storage_ptr__,utils *this,vertex_iterator start_vtx,vertex_iterator goal_vtx)

{
  vertex_iterator waypoint;
  VertexMapTypeIterator local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (local_20.
         super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
         ._M_cur = (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                    )(_Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                      )start_vtx.super_const_vertex_iterator.super_VertexMapTypeIterator.
                       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                       ._M_cur,
        start_vtx.super_const_vertex_iterator.super_VertexMapTypeIterator.
        super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
        ._M_cur != (const_vertex_iterator)this) {
    std::
    vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_20);
    start_vtx.super_const_vertex_iterator.super_VertexMapTypeIterator.
    super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
    ._M_cur = *(const_vertex_iterator *)
               (*(long *)((long)local_20.
                                super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                                ._M_cur + 0x10) + 0x68);
  }
  std::
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  ::push_back(__return_storage_ptr__,(value_type *)&local_20);
  std::
  __reverse<__gnu_cxx::__normal_iterator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator*,std::vector<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator,std::allocator<xmotion::Graph<SimpleState*,double,SimpleStateIndexer>::vertex_iterator>>>>
            ((__return_storage_ptr__->
             super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<VertexIterator> ReconstructPath(VertexIterator start_vtx,
                                                   VertexIterator goal_vtx) {
  std::vector<VertexIterator> path;
  VertexIterator waypoint = goal_vtx;
  while (waypoint != start_vtx) {
    path.push_back(waypoint);
    waypoint = waypoint->search_parent;
  }
  // add the start node
  path.push_back(waypoint);
  std::reverse(path.begin(), path.end());
#ifndef MINIMAL_PRINTOUT
  auto traj_s = path.begin();
  auto traj_e = path.end() - 1;
  std::cout << "starting vertex id: " << (*traj_s)->vertex_id_ << std::endl;
  std::cout << "finishing vertex id: " << (*traj_e)->vertex_id_ << std::endl;
  std::cout << "path length: " << path.size() << std::endl;
  std::cout << "total cost: " << path.back()->g_cost << std::endl;
#endif
  return path;
}